

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void printsub(Curl_easy *data,int direction,uchar *pointer,size_t length)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uchar uVar4;
  uint uVar5;
  ulong uVar6;
  curl_trc_feat *pcVar7;
  ulong uVar8;
  char *pcVar9;
  char *fmt;
  ulong uVar10;
  
  if (((data->set).field_0x8cd & 0x10) == 0) {
    return;
  }
  pcVar7 = (data->state).feat;
  if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
    pcVar9 = "SENT";
    if (direction == 0x3c) {
      pcVar9 = "RCVD";
    }
    Curl_infof(data,"%s IAC SB ",pcVar9);
  }
  if (length < 3) {
    if (length == 2) {
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return;
      }
      pcVar7 = (data->state).feat;
      if ((pcVar7 != (curl_trc_feat *)0x0) && (pcVar7->log_level < 1)) {
        return;
      }
      Curl_infof(data,"(Empty suboption?)");
      return;
    }
    uVar8 = 0;
  }
  else {
    bVar1 = pointer[length - 2];
    uVar8 = (ulong)bVar1;
    bVar2 = pointer[length - 1];
    if (bVar2 != 0xf0 || bVar1 != 0xff) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"(terminated by ");
      }
      if (bVar1 < 0x28) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          pcVar9 = telnetoptions[uVar8];
LAB_00159e59:
          Curl_infof(data,"%s ",pcVar9);
        }
      }
      else {
        uVar5 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
        if (bVar1 < 0xec) {
          if (((uVar5 >> 0x1c & 1) != 0) &&
             ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
              (0 < pcVar7->log_level)))) {
            Curl_infof(data,"%u ",(ulong)bVar1);
          }
        }
        else if (((uVar5 >> 0x1c & 1) != 0) &&
                ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar7->log_level)))) {
          pcVar9 = telnetcmds[bVar1 - 0xec];
          goto LAB_00159e59;
        }
      }
      if (bVar2 < 0x28) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          pcVar9 = telnetoptions[bVar2];
LAB_00159f0a:
          Curl_infof(data,"%s",pcVar9);
        }
      }
      else {
        uVar5 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
        if (bVar2 < 0xec) {
          if (((uVar5 >> 0x1c & 1) != 0) &&
             ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
              (0 < pcVar7->log_level)))) {
            Curl_infof(data,"%d");
          }
        }
        else if (((uVar5 >> 0x1c & 1) != 0) &&
                ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar7->log_level)))) {
          pcVar9 = telnetcmds[bVar2 - 0xec];
          goto LAB_00159f0a;
        }
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,", not IAC SE) ");
      }
    }
  }
  uVar10 = length - 2;
  uVar6 = (ulong)*pointer;
  if (uVar6 < 0x28) {
    if ((*pointer < 0x28) && ((0x8881000000U >> (uVar6 & 0x3f) & 1) != 0)) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        pcVar9 = telnetoptions[uVar6];
        fmt = "%s";
LAB_00159fc4:
        Curl_infof(data,fmt,pcVar9);
      }
    }
    else if ((((data->set).field_0x8cd & 0x10) != 0) &&
            ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)
             ))) {
      pcVar9 = telnetoptions[uVar6];
      fmt = "%s (unsupported)";
      goto LAB_00159fc4;
    }
  }
  else if ((((data->set).field_0x8cd & 0x10) != 0) &&
          ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))
          ) {
    Curl_infof(data,"%d (unknown)",(ulong)pointer[uVar8]);
  }
  uVar4 = *pointer;
  if (uVar4 == '\x1f') {
    if (uVar10 < 5) {
      return;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return;
    }
    pcVar7 = (data->state).feat;
    if ((pcVar7 != (curl_trc_feat *)0x0) && (pcVar7->log_level < 1)) {
      return;
    }
    Curl_infof(data,"Width: %d ; Height: %d",
               (ulong)(ushort)(*(ushort *)(pointer + 1) << 8 | *(ushort *)(pointer + 1) >> 8),
               (ulong)(ushort)(*(ushort *)(pointer + 3) << 8 | *(ushort *)(pointer + 3) >> 8));
    return;
  }
  switch(pointer[1]) {
  case '\0':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar7 = (data->state).feat;
      pcVar9 = " IS";
LAB_0015a0fc:
      if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
        Curl_infof(data,pcVar9);
      }
    }
    break;
  case '\x01':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar7 = (data->state).feat;
      pcVar9 = " SEND";
      goto LAB_0015a0fc;
    }
    break;
  case '\x02':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar7 = (data->state).feat;
      pcVar9 = " INFO/REPLY";
      goto LAB_0015a0fc;
    }
    break;
  case '\x03':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar7 = (data->state).feat;
      pcVar9 = " NAME";
      goto LAB_0015a0fc;
    }
    break;
  default:
    goto switchD_0015a098_default;
  }
  uVar4 = *pointer;
switchD_0015a098_default:
  if ((uVar4 == '\x18') || (uVar4 == '#')) {
    pointer[uVar10] = '\0';
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data," \"%s\"",pointer + 2);
      return;
    }
  }
  else if (uVar4 == '\'') {
    if (pointer[1] == '\0') {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data," ");
      }
      if (3 < uVar10) {
        uVar8 = 3;
        uVar6 = 4;
        do {
          uVar5 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
          if (pointer[uVar8] == '\x01') {
            if (((uVar5 >> 0x1c & 1) != 0) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              pcVar9 = " = ";
LAB_0015a1e2:
              Curl_infof(data,pcVar9);
            }
          }
          else if (pointer[uVar8] == '\0') {
            if (((uVar5 >> 0x1c & 1) != 0) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              pcVar9 = ", ";
              goto LAB_0015a1e2;
            }
          }
          else if (((uVar5 >> 0x1c & 1) != 0) &&
                  ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                   (0 < pcVar7->log_level)))) {
            Curl_infof(data,"%c");
          }
          bVar3 = uVar6 < uVar10;
          uVar8 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar3);
      }
    }
  }
  else if (2 < uVar10) {
    uVar8 = 2;
    uVar6 = 3;
    do {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data," %.2x",(ulong)pointer[uVar8]);
      }
      bVar3 = uVar6 < uVar10;
      uVar8 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  return;
}

Assistant:

static void printsub(struct Curl_easy *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  if(data->set.verbose) {
    unsigned int i = 0;
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<') ? "RCVD" : "SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE) ");
        }
      }
      length -= 2;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      if(length > 4)
        infof(data, "Width: %d ; Height: %d", (pointer[1] << 8) | pointer[2],
              (pointer[3] << 8) | pointer[4]);
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3; i < length; i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
  }
}